

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floating_point_stream_compression.c
# Opt level: O1

void trico_fill_code(uint8_t **out,uint32_t *xor1,uint32_t *xor2,uint32_t *bcode)

{
  long lVar1;
  uint8_t *puVar2;
  uint32_t uVar3;
  uint uVar4;
  long lVar5;
  uint32_t k;
  long lVar6;
  uint32_t *puVar7;
  uint8_t uVar8;
  
  uVar4 = bcode[1] << 3 | bcode[2] << 6 | bcode[3] << 9 |
          bcode[4] << 0xc | bcode[5] << 0xf | bcode[6] << 0x12 | bcode[7] << 0x15 | *bcode;
  puVar2 = *out;
  *out = puVar2 + 1;
  *puVar2 = (uint8_t)(uVar4 >> 0x10);
  puVar2 = *out;
  *out = puVar2 + 1;
  *puVar2 = (uint8_t)(uVar4 >> 8);
  puVar2 = *out;
  *out = puVar2 + 1;
  *puVar2 = (uint8_t)uVar4;
  lVar5 = 0;
  lVar6 = 0;
  do {
    switch(*(undefined4 *)((long)bcode + lVar5)) {
    case 1:
      puVar7 = xor1 + lVar6;
      break;
    case 2:
      goto LAB_00109faa;
    case 3:
      goto LAB_00109f92;
    case 4:
      uVar8 = *(uint8_t *)((long)xor1 + lVar5 + 3);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
LAB_00109f92:
      uVar8 = *(uint8_t *)((long)xor1 + lVar5 + 2);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
LAB_00109faa:
      puVar7 = xor1 + lVar6;
      uVar8 = *(uint8_t *)((long)xor1 + lVar5 + 1);
LAB_00109fd2:
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
      break;
    case 5:
      puVar7 = xor2 + lVar6;
      break;
    case 6:
      lVar1 = lVar6 * 4;
      goto LAB_00109fcd;
    case 7:
      uVar8 = *(uint8_t *)((long)xor2 + lVar5 + 2);
      puVar2 = *out;
      *out = puVar2 + 1;
      *puVar2 = uVar8;
      lVar1 = lVar5;
LAB_00109fcd:
      puVar7 = (uint32_t *)((long)xor2 + lVar1);
      uVar8 = *(uint8_t *)((long)xor2 + lVar5 + 1);
      goto LAB_00109fd2;
    default:
      goto switchD_00109f67_default;
    }
    uVar3 = *puVar7;
    puVar2 = *out;
    *out = puVar2 + 1;
    *puVar2 = (uint8_t)uVar3;
switchD_00109f67_default:
    lVar6 = lVar6 + 1;
    lVar5 = lVar5 + 4;
    if (lVar5 == 0x20) {
      return;
    }
  } while( true );
}

Assistant:

static inline void trico_fill_code(uint8_t** out, uint32_t* xor1, uint32_t* xor2, uint32_t* bcode)
  {
  uint32_t bc = (bcode[7] << 21) | (bcode[6] << 18) | (bcode[5] << 15) | (bcode[4] << 12) | (bcode[3] << 9) | (bcode[2] << 6) | (bcode[1] << 3) | bcode[0];

  *(*out)++ = (uint8_t)(bc >> 16);
  *(*out)++ = (uint8_t)((bc >> 8) & 0xff);
  *(*out)++ = (uint8_t)(bc & 0xff);

  for (uint32_t k = 0; k < 8; ++k)
    {
    switch (bcode[k])
      {
      case 0:
      {
      break;
      }
      case 1:
      {
      *(*out)++ = (uint8_t)(xor1[k]);
      break;
      }
      case 2:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 3:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 16));
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 4:
      {
      *(*out)++ = (uint8_t)((xor1[k] >> 24));
      *(*out)++ = (uint8_t)((xor1[k] >> 16) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor1[k]) & 0xff);
      break;
      }
      case 5:
      {
      *(*out)++ = (uint8_t)(xor2[k]);
      break;
      }
      case 6:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      case 7:
      {
      *(*out)++ = (uint8_t)((xor2[k] >> 16));
      *(*out)++ = (uint8_t)((xor2[k] >> 8) & 0xff);
      *(*out)++ = (uint8_t)((xor2[k]) & 0xff);
      break;
      }
      }
    }
  }